

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O0

REF_STATUS
ref_inflate_face(REF_GRID_conflict ref_grid,REF_DICT faceids,REF_DBL *origin,REF_DBL thickness,
                REF_DBL xshift)

{
  int node0_00;
  int node1_00;
  REF_MPI ref_mpi_00;
  REF_NODE ref_node_00;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_CELL ref_cell_01;
  bool bVar1;
  REF_STATUS RVar2;
  REF_BOOL RVar3;
  uint uVar4;
  long lVar5;
  double dVar6;
  REF_INT local_3fc;
  double local_3f8;
  double local_3e8;
  double local_3e0;
  double local_3d0;
  REF_INT local_3c8;
  int local_3c4;
  REF_GLOB local_3c0;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_INT ref_malloc_init_i_10;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_INT ref_malloc_init_i_9;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_INT ref_malloc_init_i_8;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_INT ref_malloc_init_i_7;
  REF_INT ref_malloc_init_i_6;
  REF_INT ref_malloc_init_i_5;
  REF_INT ref_malloc_init_i_4;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_BOOL verbose;
  REF_BOOL debug;
  REF_BOOL problem_detected;
  REF_DBL theta;
  void *pvStack_2b0;
  REF_INT i;
  REF_DBL *face_normal;
  REF_INT *imax;
  REF_INT *imin;
  REF_DBL *tmax;
  REF_DBL *tmin;
  REF_DBL *orient;
  REF_DBL temp;
  REF_DBL y1;
  REF_DBL y0;
  REF_DBL dy;
  REF_DBL *ymax;
  REF_DBL *ymin;
  REF_INT ref;
  REF_INT item;
  REF_INT ref_nodes [27];
  REF_DBL dot;
  REF_DBL normal [3];
  REF_DBL min_dot;
  int local_1a0;
  REF_INT new_cell;
  REF_INT node;
  REF_INT new_node;
  REF_GLOB global;
  REF_GLOB *o2g;
  void *pvStack_180;
  REF_INT o2n_max;
  REF_INT *o2n;
  int local_170;
  REF_INT tri_node;
  REF_INT quads [2];
  REF_INT nquad;
  REF_INT tris [2];
  REF_INT ntri;
  REF_INT new_nodes [27];
  int local_e4;
  REF_INT nodes [27];
  REF_INT node1;
  REF_INT node0;
  REF_INT tri_side;
  REF_INT cell;
  REF_CELL pri;
  REF_CELL qua;
  REF_CELL tri;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_DBL xshift_local;
  REF_DBL thickness_local;
  REF_DBL *origin_local;
  REF_DICT faceids_local;
  REF_GRID_conflict ref_grid_local;
  
  ref_mpi_00 = ref_grid->mpi;
  ref_node_00 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  ref_cell_00 = ref_grid->cell[6];
  ref_cell_01 = ref_grid->cell[10];
  bVar1 = false;
  if (faceids->n * 3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x73,
           "ref_inflate_face","malloc face_normal of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    pvStack_2b0 = malloc((long)(faceids->n * 3) << 3);
    if (pvStack_2b0 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0x73,"ref_inflate_face","malloc face_normal of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_malloc_init_i_2 = 0;
          SBORROW4(ref_malloc_init_i_2,faceids->n * 3) != ref_malloc_init_i_2 + faceids->n * -3 < 0;
          ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
        *(undefined8 *)((long)pvStack_2b0 + (long)ref_malloc_init_i_2 * 8) = 0xbff0000000000000;
      }
      if (faceids->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
               0x77,"ref_inflate_face","malloc ymin of REF_DBL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        ymax = (REF_DBL *)malloc((long)faceids->n << 3);
        if (ymax == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                 ,0x77,"ref_inflate_face","malloc ymin of REF_DBL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_malloc_init_i_3 = 0; ref_malloc_init_i_3 < faceids->n;
              ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
            ymax[ref_malloc_init_i_3] = 1e+200;
          }
          if (faceids->n < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                   ,0x78,"ref_inflate_face","malloc ymax of REF_DBL negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            dy = (REF_DBL)malloc((long)faceids->n << 3);
            if ((void *)dy == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                     ,0x78,"ref_inflate_face","malloc ymax of REF_DBL NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < faceids->n;
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                *(undefined8 *)((long)dy + (long)ref_private_macro_code_rss * 8) =
                     0xe974e718d7d7625a;
              }
              if (faceids->n < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                       ,0x79,"ref_inflate_face","malloc orient of REF_DBL negative");
                ref_grid_local._4_4_ = 1;
              }
              else {
                tmin = (REF_DBL *)malloc((long)faceids->n << 3);
                if (tmin == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                         ,0x79,"ref_inflate_face","malloc orient of REF_DBL NULL");
                  ref_grid_local._4_4_ = 2;
                }
                else {
                  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < faceids->n;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    tmin[ref_private_macro_code_rss_1] = 1.0;
                  }
                  y1 = 1e+200;
                  temp = -1e+200;
                  for (node0 = 0; node0 < ref_cell->max; node0 = node0 + 1) {
                    RVar2 = ref_cell_nodes(ref_cell,node0,new_nodes + 0x1a);
                    if ((RVar2 == 0) && (RVar3 = ref_dict_has_key(faceids,nodes[1]), RVar3 != 0)) {
                      for (o2n._4_4_ = 0; o2n._4_4_ < 3; o2n._4_4_ = o2n._4_4_ + 1) {
                        uVar4 = ref_dict_location(faceids,nodes[1],(REF_INT *)((long)&theta + 4));
                        if (uVar4 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                 ,0x80,"ref_inflate_face",(ulong)uVar4,"key loc");
                          return uVar4;
                        }
                        local_1a0 = new_nodes[(long)o2n._4_4_ + 0x1a];
                        y0 = ref_node_00->real[local_1a0 * 0xf + 1] - origin[1];
                        if (y0 < ymax[(int)theta._4_4_]) {
                          ymax[(int)theta._4_4_] = y0;
                        }
                        if (*(double *)((long)dy + (long)(int)theta._4_4_ * 8) < y0) {
                          *(REF_DBL *)((long)dy + (long)(int)theta._4_4_ * 8) = y0;
                        }
                        if (y0 < y1) {
                          y1 = y0;
                        }
                        if (temp < y0) {
                          temp = y0;
                        }
                      }
                    }
                  }
                  orient = (REF_DBL *)y1;
                  ref_grid_local._4_4_ = ref_mpi_min(ref_mpi_00,&orient,&y1,3);
                  if (ref_grid_local._4_4_ == 0) {
                    ref_grid_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&y1,1,3);
                    if (ref_grid_local._4_4_ == 0) {
                      orient = (REF_DBL *)temp;
                      ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&orient,&temp,3);
                      if (ref_grid_local._4_4_ == 0) {
                        ref_grid_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&temp,1,3);
                        if (ref_grid_local._4_4_ == 0) {
                          for (theta._4_4_ = 0; (int)theta._4_4_ < faceids->n;
                              theta._4_4_ = theta._4_4_ + 1) {
                            orient = (REF_DBL *)ymax[(int)theta._4_4_];
                            uVar4 = ref_mpi_min(ref_mpi_00,&orient,ymax + (int)theta._4_4_,3);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                     ,0x9c,"ref_inflate_face",(ulong)uVar4,"max thresh");
                              return uVar4;
                            }
                            uVar4 = ref_mpi_bcast(ref_mpi_00,ymax + (int)theta._4_4_,1,3);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                     ,0x9d,"ref_inflate_face",(ulong)uVar4,"bcast");
                              return uVar4;
                            }
                            orient = *(REF_DBL **)((long)dy + (long)(int)theta._4_4_ * 8);
                            uVar4 = ref_mpi_max(ref_mpi_00,&orient,
                                                (void *)((long)dy + (long)(int)theta._4_4_ * 8),3);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                     ,0x9f,"ref_inflate_face",(ulong)uVar4,"max thresh");
                              return uVar4;
                            }
                            uVar4 = ref_mpi_bcast(ref_mpi_00,
                                                  (void *)((long)dy + (long)(int)theta._4_4_ * 8),1,
                                                  3);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                     ,0xa0,"ref_inflate_face",(ulong)uVar4,"bcast");
                              return uVar4;
                            }
                            if (temp - *(double *)((long)dy + (long)(int)theta._4_4_ * 8) <=
                                ymax[(int)theta._4_4_] - y1) {
                              tmin[(int)theta._4_4_] = 1.0;
                            }
                            else {
                              tmin[(int)theta._4_4_] = -1.0;
                            }
                          }
                          if (faceids->n < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                   ,0xa9,"ref_inflate_face","malloc tmin of REF_DBL negative");
                            ref_grid_local._4_4_ = 1;
                          }
                          else {
                            tmax = (REF_DBL *)malloc((long)faceids->n << 3);
                            if (tmax == (REF_DBL *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                     ,0xa9,"ref_inflate_face","malloc tmin of REF_DBL NULL");
                              ref_grid_local._4_4_ = 2;
                            }
                            else {
                              for (ref_malloc_init_i_6 = 0; ref_malloc_init_i_6 < faceids->n;
                                  ref_malloc_init_i_6 = ref_malloc_init_i_6 + 1) {
                                tmax[ref_malloc_init_i_6] = 12.56637061435916;
                              }
                              if (faceids->n < 0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                       ,0xaa,"ref_inflate_face","malloc tmax of REF_DBL negative");
                                ref_grid_local._4_4_ = 1;
                              }
                              else {
                                imin = (REF_INT *)malloc((long)faceids->n << 3);
                                if (imin == (REF_INT *)0x0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                         ,0xaa,"ref_inflate_face","malloc tmax of REF_DBL NULL");
                                  ref_grid_local._4_4_ = 2;
                                }
                                else {
                                  for (ref_malloc_init_i_7 = 0; ref_malloc_init_i_7 < faceids->n;
                                      ref_malloc_init_i_7 = ref_malloc_init_i_7 + 1) {
                                    (imin + (long)ref_malloc_init_i_7 * 2)[0] = 0x54442d11;
                                    (imin + (long)ref_malloc_init_i_7 * 2)[1] = -0x3fd6de05;
                                  }
                                  if (faceids->n < 0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                           ,0xab,"ref_inflate_face",
                                           "malloc imin of REF_INT negative");
                                    ref_grid_local._4_4_ = 1;
                                  }
                                  else {
                                    imax = (REF_INT *)malloc((long)faceids->n << 2);
                                    if (imax == (REF_INT *)0x0) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                             ,0xab,"ref_inflate_face","malloc imin of REF_INT NULL")
                                      ;
                                      ref_grid_local._4_4_ = 2;
                                    }
                                    else {
                                      for (ref_private_macro_code_rss_9 = 0;
                                          ref_private_macro_code_rss_9 < faceids->n;
                                          ref_private_macro_code_rss_9 =
                                               ref_private_macro_code_rss_9 + 1) {
                                        imax[ref_private_macro_code_rss_9] = -1;
                                      }
                                      if (faceids->n < 0) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                               ,0xac,"ref_inflate_face",
                                               "malloc imax of REF_INT negative");
                                        ref_grid_local._4_4_ = 1;
                                      }
                                      else {
                                        face_normal = (REF_DBL *)malloc((long)faceids->n << 2);
                                        if (face_normal == (REF_DBL *)0x0) {
                                          printf("%s: %d: %s: %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                 ,0xac,"ref_inflate_face",
                                                 "malloc imax of REF_INT NULL");
                                          ref_grid_local._4_4_ = 2;
                                        }
                                        else {
                                          for (ref_private_macro_code_rss_10 = 0;
                                              ref_private_macro_code_rss_10 < faceids->n;
                                              ref_private_macro_code_rss_10 =
                                                   ref_private_macro_code_rss_10 + 1) {
                                            *(undefined4 *)
                                             ((long)face_normal +
                                             (long)ref_private_macro_code_rss_10 * 4) = 0xffffffff;
                                          }
                                          for (node0 = 0; node0 < ref_cell->max; node0 = node0 + 1)
                                          {
                                            RVar2 = ref_cell_nodes(ref_cell,node0,new_nodes + 0x1a);
                                            if ((RVar2 == 0) &&
                                               (RVar3 = ref_dict_has_key(faceids,nodes[1]),
                                               RVar3 != 0)) {
                                              for (o2n._4_4_ = 0; o2n._4_4_ < 3;
                                                  o2n._4_4_ = o2n._4_4_ + 1) {
                                                uVar4 = ref_dict_location(faceids,nodes[1],
                                                                          (REF_INT *)
                                                                          ((long)&theta + 4));
                                                if (uVar4 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0xb1,"ref_inflate_face",(ulong)uVar4,"key loc");
                                                  return uVar4;
                                                }
                                                local_1a0 = new_nodes[(long)o2n._4_4_ + 0x1a];
                                                dVar6 = atan2(ref_node_00->real[local_1a0 * 0xf + 2]
                                                              - origin[2],
                                                              tmin[(int)theta._4_4_] *
                                                              (ref_node_00->real
                                                               [local_1a0 * 0xf + 1] - origin[1]));
                                                if (dVar6 < tmax[(int)theta._4_4_]) {
                                                  tmax[(int)theta._4_4_] = dVar6;
                                                  imax[(int)theta._4_4_] = local_1a0;
                                                }
                                                if (*(double *)(imin + (long)(int)theta._4_4_ * 2) <
                                                    dVar6) {
                                                  *(double *)(imin + (long)(int)theta._4_4_ * 2) =
                                                       dVar6;
                                                  *(int *)((long)face_normal +
                                                          (long)(int)theta._4_4_ * 4) = local_1a0;
                                                }
                                              }
                                            }
                                          }
                                          for (theta._4_4_ = 0; (int)theta._4_4_ < faceids->n;
                                              theta._4_4_ = theta._4_4_ + 1) {
                                            if (ref_mpi_00->n < 2) {
                                              if (imax[(int)theta._4_4_] == -1) {
                                                printf("%s: %d: %s: %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,199,"ref_inflate_face","imin");
                                                printf("empty %d: %d \n",(ulong)theta._4_4_,
                                                       (ulong)(uint)faceids->key[(int)theta._4_4_]);
                                                return 1;
                                              }
                                              if (*(int *)((long)face_normal +
                                                          (long)(int)theta._4_4_ * 4) == -1) {
                                                printf("%s: %d: %s: %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0xc9,"ref_inflate_face","imax");
                                                printf("empty %d: %d \n",(ulong)theta._4_4_,
                                                       (ulong)(uint)faceids->key[(int)theta._4_4_]);
                                                return 1;
                                              }
                                            }
                                            if ((imax[(int)theta._4_4_] != -1) &&
                                               (*(int *)((long)face_normal +
                                                        (long)(int)theta._4_4_ * 4) != -1)) {
                                              *(undefined8 *)
                                               ((long)pvStack_2b0 + (long)(int)(theta._4_4_ * 3) * 8
                                               ) = 0;
                                              *(double *)
                                               ((long)pvStack_2b0 +
                                               (long)(int)(theta._4_4_ * 3 + 1) * 8) =
                                                   ref_node_00->real
                                                   [*(int *)((long)face_normal +
                                                            (long)(int)theta._4_4_ * 4) * 0xf + 2] -
                                                   ref_node_00->real
                                                   [imax[(int)theta._4_4_] * 0xf + 2];
                                              *(double *)
                                               ((long)pvStack_2b0 +
                                               (long)(int)(theta._4_4_ * 3 + 2) * 8) =
                                                   -(ref_node_00->real
                                                     [*(int *)((long)face_normal +
                                                              (long)(int)theta._4_4_ * 4) * 0xf + 1]
                                                    - ref_node_00->real
                                                      [imax[(int)theta._4_4_] * 0xf + 1]);
                                              lVar5 = (long)(int)(theta._4_4_ * 3 + 1);
                                              *(double *)((long)pvStack_2b0 + lVar5 * 8) =
                                                   -tmin[(int)theta._4_4_] *
                                                   *(double *)((long)pvStack_2b0 + lVar5 * 8);
                                              lVar5 = (long)(int)(theta._4_4_ * 3 + 2);
                                              *(double *)((long)pvStack_2b0 + lVar5 * 8) =
                                                   -tmin[(int)theta._4_4_] *
                                                   *(double *)((long)pvStack_2b0 + lVar5 * 8);
                                              uVar4 = ref_math_normalize((REF_DBL *)
                                                                         ((long)pvStack_2b0 +
                                                                         (long)(int)(theta._4_4_ * 3
                                                                                    ) * 8));
                                              if (uVar4 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0xd6,"ref_inflate_face",(ulong)uVar4,
                                                  "make face norm");
                                                return uVar4;
                                              }
                                            }
                                          }
                                          if (face_normal != (REF_DBL *)0x0) {
                                            free(face_normal);
                                          }
                                          if (imax != (REF_INT *)0x0) {
                                            free(imax);
                                          }
                                          if (imin != (REF_INT *)0x0) {
                                            free(imin);
                                          }
                                          if (tmax != (REF_DBL *)0x0) {
                                            free(tmax);
                                          }
                                          if (tmin != (REF_DBL *)0x0) {
                                            free(tmin);
                                          }
                                          if (dy != 0.0) {
                                            free((void *)dy);
                                          }
                                          if (ymax != (REF_DBL *)0x0) {
                                            free(ymax);
                                          }
                                          o2g._4_4_ = ref_node_00->max;
                                          if (ref_node_00->max < 0) {
                                            printf("%s: %d: %s: %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0xec,"ref_inflate_face",
                                                  "malloc o2n of REF_INT negative");
                                            ref_grid_local._4_4_ = 1;
                                          }
                                          else {
                                            pvStack_180 = malloc((long)ref_node_00->max << 2);
                                            if (pvStack_180 == (void *)0x0) {
                                              printf("%s: %d: %s: %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0xec,"ref_inflate_face",
                                                  "malloc o2n of REF_INT NULL");
                                              ref_grid_local._4_4_ = 2;
                                            }
                                            else {
                                              for (ref_private_macro_code_rss_12 = 0;
                                                  ref_private_macro_code_rss_12 < ref_node_00->max;
                                                  ref_private_macro_code_rss_12 =
                                                       ref_private_macro_code_rss_12 + 1) {
                                                *(undefined4 *)
                                                 ((long)pvStack_180 +
                                                 (long)ref_private_macro_code_rss_12 * 4) =
                                                     0xffffffff;
                                              }
                                              for (node0 = 0; node0 < ref_cell->max;
                                                  node0 = node0 + 1) {
                                                RVar2 = ref_cell_nodes(ref_cell,node0,
                                                                       new_nodes + 0x1a);
                                                if ((RVar2 == 0) &&
                                                   (RVar3 = ref_dict_has_key(faceids,nodes[1]),
                                                   RVar3 != 0)) {
                                                  for (o2n._4_4_ = 0; o2n._4_4_ < 3;
                                                      o2n._4_4_ = o2n._4_4_ + 1) {
                                                    local_1a0 = new_nodes[(long)o2n._4_4_ + 0x1a];
                                                    if ((ref_node_00->ref_mpi->id ==
                                                         ref_node_00->part[local_1a0]) &&
                                                       (*(int *)((long)pvStack_180 +
                                                                (long)local_1a0 * 4) == -1)) {
                                                      uVar4 = ref_node_next_global
                                                                        (ref_node_00,
                                                                         (REF_GLOB *)&node);
                                                      if (uVar4 != 0) {
                                                        printf("%s: %d: %s: %d %s\n",
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0xf4,"ref_inflate_face",(ulong)uVar4,"global");
                                                  return uVar4;
                                                  }
                                                  uVar4 = ref_node_add(ref_node_00,_node,&new_cell);
                                                  if (uVar4 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0xf5,"ref_inflate_face",(ulong)uVar4,"add node");
                                                  return uVar4;
                                                  }
                                                  ref_node_00->part[new_cell] = ref_mpi_00->id;
                                                  *(REF_INT *)
                                                   ((long)pvStack_180 + (long)local_1a0 * 4) =
                                                       new_cell;
                                                  }
                                                  }
                                                }
                                              }
                                              ref_grid_local._4_4_ =
                                                   ref_node_shift_new_globals(ref_node_00);
                                              if (ref_grid_local._4_4_ == 0) {
                                                if (ref_node_00->max < 0) {
                                                  printf("%s: %d: %s: %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x101,"ref_inflate_face",
                                                  "malloc o2g of REF_GLOB negative");
                                                  ref_grid_local._4_4_ = 1;
                                                }
                                                else {
                                                  global = (REF_GLOB)
                                                           malloc((long)ref_node_00->max << 3);
                                                  if ((REF_GLOB *)global == (REF_GLOB *)0x0) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x101,"ref_inflate_face",
                                                  "malloc o2g of REF_GLOB NULL");
                                                  ref_grid_local._4_4_ = 2;
                                                  }
                                                  else {
                                                    for (ref_malloc_init_i_10 = 0;
                                                        ref_malloc_init_i_10 < ref_node_00->max;
                                                        ref_malloc_init_i_10 =
                                                             ref_malloc_init_i_10 + 1) {
                                                      *(REF_GLOB *)
                                                       (global + (long)ref_malloc_init_i_10 * 8) =
                                                           -1;
                                                    }
                                                    for (local_1a0 = 0; local_1a0 < o2g._4_4_;
                                                        local_1a0 = local_1a0 + 1) {
                                                      if (*(int *)((long)pvStack_180 +
                                                                  (long)local_1a0 * 4) != -1) {
                                                        if (((*(int *)((long)pvStack_180 +
                                                                      (long)local_1a0 * 4) < 0) ||
                                                            (ref_node_00->max <=
                                                             *(int *)((long)pvStack_180 +
                                                                     (long)local_1a0 * 4))) ||
                                                           (ref_node_00->global
                                                            [*(int *)((long)pvStack_180 +
                                                                     (long)local_1a0 * 4)] < 0)) {
                                                          local_3c0 = -1;
                                                        }
                                                        else {
                                                          local_3c0 = ref_node_00->global
                                                                      [*(int *)((long)pvStack_180 +
                                                                               (long)local_1a0 * 4)]
                                                          ;
                                                        }
                                                        *(REF_GLOB *)(global + (long)local_1a0 * 8)
                                                             = local_3c0;
                                                      }
                                                    }
                                                    ref_grid_local._4_4_ =
                                                         ref_node_ghost_glob(ref_node_00,
                                                                             (REF_GLOB *)global,1);
                                                    if (ref_grid_local._4_4_ == 0) {
                                                      if (pvStack_180 != (void *)0x0) {
                                                        free(pvStack_180);
                                                      }
                                                      o2g._4_4_ = ref_node_00->max;
                                                      if (ref_node_00->max < 0) {
                                                        printf("%s: %d: %s: %s\n",
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x10d,"ref_inflate_face",
                                                  "malloc o2n of REF_INT negative");
                                                  ref_grid_local._4_4_ = 1;
                                                  }
                                                  else {
                                                    pvStack_180 = malloc((long)ref_node_00->max << 2
                                                                        );
                                                    if (pvStack_180 == (void *)0x0) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x10d,"ref_inflate_face",
                                                  "malloc o2n of REF_INT NULL");
                                                  ref_grid_local._4_4_ = 2;
                                                  }
                                                  else {
                                                    for (ref_private_macro_code_rss_16 = 0;
                                                        ref_private_macro_code_rss_16 <
                                                        ref_node_00->max;
                                                        ref_private_macro_code_rss_16 =
                                                             ref_private_macro_code_rss_16 + 1) {
                                                      *(undefined4 *)
                                                       ((long)pvStack_180 +
                                                       (long)ref_private_macro_code_rss_16 * 4) =
                                                           0xffffffff;
                                                    }
                                                    for (local_1a0 = 0; local_1a0 < o2g._4_4_;
                                                        local_1a0 = local_1a0 + 1) {
                                                      if (*(long *)(global + (long)local_1a0 * 8) !=
                                                          -1) {
                                                        uVar4 = ref_node_add(ref_node_00,
                                                                             *(REF_GLOB *)
                                                                              (global + (long)
                                                  local_1a0 * 8),&new_cell);
                                                  if (uVar4 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x112,"ref_inflate_face",(ulong)uVar4,"add node")
                                                  ;
                                                  return uVar4;
                                                  }
                                                  ref_node_00->part[new_cell] =
                                                       ref_node_00->part[local_1a0];
                                                  *(REF_INT *)
                                                   ((long)pvStack_180 + (long)local_1a0 * 4) =
                                                       new_cell;
                                                  }
                                                  }
                                                  for (local_1a0 = 0; local_1a0 < o2g._4_4_;
                                                      local_1a0 = local_1a0 + 1) {
                                                    if (((-1 < local_1a0) &&
                                                        (local_1a0 < ref_node_00->max)) &&
                                                       ((-1 < ref_node_00->global[local_1a0] &&
                                                        ((ref_node_00->ref_mpi->id ==
                                                          ref_node_00->part[local_1a0] &&
                                                         (*(int *)((long)pvStack_180 +
                                                                  (long)local_1a0 * 4) != -1)))))) {
                                                      new_cell = *(REF_INT *)
                                                                  ((long)pvStack_180 +
                                                                  (long)local_1a0 * 4);
                                                      dot = 0.0;
                                                      normal[0] = ref_node_00->real
                                                                  [local_1a0 * 0xf + 1] - origin[1];
                                                      normal[1] = ref_node_00->real
                                                                  [local_1a0 * 0xf + 2] - origin[2];
                                                      uVar4 = ref_math_normalize(&dot);
                                                      if (uVar4 != 0) {
                                                        printf("%s: %d: %s: %d %s\n",
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x120,"ref_inflate_face",(ulong)uVar4,"make norm"
                                                  );
                                                  return uVar4;
                                                  }
                                                  if ((local_1a0 < 0) ||
                                                     (ref_cell->ref_adj->nnode <= local_1a0)) {
                                                    local_3c4 = -1;
                                                  }
                                                  else {
                                                    local_3c4 = ref_cell->ref_adj->first[local_1a0];
                                                  }
                                                  ymin._4_4_ = local_3c4;
                                                  if (local_3c4 == -1) {
                                                    local_3c8 = -1;
                                                  }
                                                  else {
                                                    local_3c8 = ref_cell->ref_adj->item[local_3c4].
                                                                ref;
                                                  }
                                                  ymin._0_4_ = local_3c8;
                                                  while (ymin._4_4_ != -1) {
                                                    uVar4 = ref_cell_nodes(ref_cell,(REF_INT)ymin,
                                                                           &ref);
                                                    if (uVar4 != 0) {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x122,"ref_inflate_face",(ulong)uVar4,"cell");
                                                  return uVar4;
                                                  }
                                                  RVar3 = ref_dict_has_key(faceids,ref_nodes[1]);
                                                  if (RVar3 != 0) {
                                                    uVar4 = ref_dict_location(faceids,ref_nodes[1],
                                                                              (REF_INT *)
                                                                              ((long)&theta + 4));
                                                    if (uVar4 != 0) {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x124,"ref_inflate_face",(ulong)uVar4,"key loc");
                                                  return uVar4;
                                                  }
                                                  dVar6 = -(normal[1] *
                                                            *(double *)
                                                             ((long)pvStack_2b0 +
                                                             (long)(int)(theta._4_4_ * 3) * 8 + 0x10
                                                             ) + dot * *(double *)
                                                                        ((long)pvStack_2b0 +
                                                                        (long)(int)(theta._4_4_ * 3)
                                                                        * 8) +
                                                                 normal[0] *
                                                                 *(double *)
                                                                  ((long)pvStack_2b0 +
                                                                  (long)(int)(theta._4_4_ * 3) * 8 +
                                                                  8));
                                                  if (*(double *)
                                                       ((long)pvStack_2b0 +
                                                       (long)(int)(theta._4_4_ * 3) * 8) <= -0.1) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x126,"ref_inflate_face",
                                                  "uninitialized face_normal");
                                                  return 1;
                                                  }
                                                  if ((dVar6 < 0.7) || (1.01 < dVar6)) {
                                                    printf("out-of-range dot %.15f at %f %f %f\n",
                                                           dVar6,ref_node_00->real[local_1a0 * 0xf],
                                                           ref_node_00->real[local_1a0 * 0xf + 1],
                                                           ref_node_00->real[local_1a0 * 0xf + 2]);
                                                    bVar1 = true;
                                                  }
                                                  if (dVar6 * 1e+20 <= 0.0) {
                                                    local_3d0 = -(dVar6 * 1e+20);
                                                  }
                                                  else {
                                                    local_3d0 = dVar6 * 1e+20;
                                                  }
                                                  if (normal[0] <= 0.0) {
                                                    local_3e0 = -normal[0];
                                                  }
                                                  else {
                                                    local_3e0 = normal[0];
                                                  }
                                                  if (local_3d0 <= local_3e0) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x136,"ref_inflate_face","normal[1] /= dot");
                                                  printf("dot %e\n",dVar6);
                                                  printf(" xyz %f %f %f\n",
                                                         ref_node_00->real[local_1a0 * 0xf],
                                                         ref_node_00->real[local_1a0 * 0xf + 1],
                                                         ref_node_00->real[local_1a0 * 0xf + 2]);
                                                  printf(" norm %f %f %f\n",dot,normal[0],normal[1])
                                                  ;
                                                  printf("%d face norm %f %f %f\n",
                                                         *(undefined8 *)
                                                          ((long)pvStack_2b0 +
                                                          (long)(int)(theta._4_4_ * 3) * 8),
                                                         *(undefined8 *)
                                                          ((long)pvStack_2b0 +
                                                          (long)(int)(theta._4_4_ * 3 + 1) * 8),
                                                         *(undefined8 *)
                                                          ((long)pvStack_2b0 +
                                                          (long)(int)(theta._4_4_ * 3 + 2) * 8),
                                                         (ulong)theta._4_4_);
                                                  return 1;
                                                  }
                                                  if (dVar6 * 1e+20 <= 0.0) {
                                                    local_3e8 = -(dVar6 * 1e+20);
                                                  }
                                                  else {
                                                    local_3e8 = dVar6 * 1e+20;
                                                  }
                                                  if (normal[1] <= 0.0) {
                                                    local_3f8 = -normal[1];
                                                  }
                                                  else {
                                                    local_3f8 = normal[1];
                                                  }
                                                  if (local_3e8 <= local_3f8) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x13f,"ref_inflate_face","normal[2] /= dot");
                                                  printf("dot %e\n",dVar6);
                                                  printf(" xyz %f %f %f\n",
                                                         ref_node_00->real[local_1a0 * 0xf],
                                                         ref_node_00->real[local_1a0 * 0xf + 1],
                                                         ref_node_00->real[local_1a0 * 0xf + 2]);
                                                  printf(" norm %f %f %f\n",dot,normal[0],normal[1])
                                                  ;
                                                  printf("%d face norm %f %f %f\n",
                                                         *(undefined8 *)
                                                          ((long)pvStack_2b0 +
                                                          (long)(int)(theta._4_4_ * 3) * 8),
                                                         *(undefined8 *)
                                                          ((long)pvStack_2b0 +
                                                          (long)(int)(theta._4_4_ * 3 + 1) * 8),
                                                         *(undefined8 *)
                                                          ((long)pvStack_2b0 +
                                                          (long)(int)(theta._4_4_ * 3 + 2) * 8),
                                                         (ulong)theta._4_4_);
                                                  return 1;
                                                  }
                                                  normal[0] = normal[0] / dVar6;
                                                  normal[1] = normal[1] / dVar6;
                                                  }
                                                  ymin._4_4_ = ref_cell->ref_adj->item[ymin._4_4_].
                                                               next;
                                                  if (ymin._4_4_ == -1) {
                                                    local_3fc = -1;
                                                  }
                                                  else {
                                                    local_3fc = ref_cell->ref_adj->item[ymin._4_4_].
                                                                ref;
                                                  }
                                                  ymin._0_4_ = local_3fc;
                                                  }
                                                  ref_node_00->real[new_cell * 0xf] =
                                                       xshift + ref_node_00->real[local_1a0 * 0xf];
                                                  ref_node_00->real[new_cell * 0xf + 1] =
                                                       thickness * normal[0] +
                                                       ref_node_00->real[local_1a0 * 0xf + 1];
                                                  ref_node_00->real[new_cell * 0xf + 2] =
                                                       thickness * normal[1] +
                                                       ref_node_00->real[local_1a0 * 0xf + 2];
                                                  }
                                                  }
                                                  if (bVar1) {
                                                    printf("ERROR: new node normal\n");
                                                  }
                                                  ref_grid_local._4_4_ =
                                                       ref_node_ghost_real(ref_node_00);
                                                  if (ref_grid_local._4_4_ == 0) {
                                                    if (pvStack_2b0 != (void *)0x0) {
                                                      free(pvStack_2b0);
                                                    }
                                                    for (node0 = 0; node0 < ref_cell->max;
                                                        node0 = node0 + 1) {
                                                      RVar2 = ref_cell_nodes(ref_cell,node0,
                                                                             new_nodes + 0x1a);
                                                      if ((RVar2 == 0) &&
                                                         (RVar3 = ref_dict_has_key(faceids,nodes[1])
                                                         , RVar3 != 0)) {
                                                        for (node1 = 0; node1 < 3; node1 = node1 + 1
                                                            ) {
                                                          node0_00 = ref_cell->c2n
                                                                     [ref_cell->e2n[node1 << 1] +
                                                                      ref_cell->size_per * node0];
                                                          node1_00 = ref_cell->c2n
                                                                     [ref_cell->e2n[node1 * 2 + 1] +
                                                                      ref_cell->size_per * node0];
                                                          if ((ref_node_00->ref_mpi->id ==
                                                               ref_node_00->part[node0_00]) ||
                                                             (ref_node_00->ref_mpi->id ==
                                                              ref_node_00->part[node1_00])) {
                                                            uVar4 = ref_cell_list_with2(ref_cell,
                                                  node0_00,node1_00,2,tris,quads + 1);
                                                  if (uVar4 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x15b,"ref_inflate_face",(ulong)uVar4,
                                                  "bad tri count");
                                                  return uVar4;
                                                  }
                                                  if (tris[0] == 1) {
                                                    uVar4 = ref_cell_list_with2(ref_cell_00,node0_00
                                                                                ,node1_00,2,quads,
                                                                                &local_170);
                                                    if (uVar4 != 0) {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x15e,"ref_inflate_face",(ulong)uVar4,
                                                  "bad quad count");
                                                  return uVar4;
                                                  }
                                                  if ((long)quads[0] != 1) {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x15f,"ref_inflate_face","tri without quad",1,
                                                  (long)quads[0]);
                                                  return 1;
                                                  }
                                                  new_nodes[2] = ref_cell_00->c2n
                                                                 [ref_cell_00->size_per * local_170
                                                                  + 4];
                                                  new_nodes[0] = *(REF_INT *)
                                                                  ((long)pvStack_180 +
                                                                  (long)node1_00 * 4);
                                                  new_nodes[1] = *(REF_INT *)
                                                                  ((long)pvStack_180 +
                                                                  (long)node0_00 * 4);
                                                  tris[1] = node0_00;
                                                  uVar4 = ref_cell_add(ref_cell_00,tris + 1,
                                                                       (REF_INT *)
                                                                       ((long)&min_dot + 4));
                                                  if (uVar4 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x165,"ref_inflate_face",(ulong)uVar4,"qua tri1")
                                                  ;
                                                  return uVar4;
                                                  }
                                                  }
                                                  else {
                                                    RVar3 = ref_dict_has_key(faceids,ref_cell->c2n
                                                                                     [ref_cell->
                                                                                      size_per *
                                                                                      quads[1] + 3])
                                                    ;
                                                    if ((RVar3 == 0) ||
                                                       (RVar3 = ref_dict_has_key(faceids,ref_cell->
                                                                                         c2n[
                                                  ref_cell->size_per * nquad + 3]), RVar3 != 0)) {
                                                    RVar3 = ref_dict_has_key(faceids,ref_cell->c2n
                                                                                     [ref_cell->
                                                                                      size_per *
                                                                                      quads[1] + 3])
                                                    ;
                                                    if ((RVar3 == 0) &&
                                                       (RVar3 = ref_dict_has_key(faceids,ref_cell->
                                                                                         c2n[
                                                  ref_cell->size_per * nquad + 3]), RVar3 != 0)) {
                                                    new_nodes[2] = ref_cell->c2n
                                                                   [ref_cell->size_per * quads[1] +
                                                                    3];
                                                    new_nodes[0] = *(REF_INT *)
                                                                    ((long)pvStack_180 +
                                                                    (long)node1_00 * 4);
                                                    new_nodes[1] = *(REF_INT *)
                                                                    ((long)pvStack_180 +
                                                                    (long)node0_00 * 4);
                                                    tris[1] = node0_00;
                                                    uVar4 = ref_cell_add(ref_cell_00,tris + 1,
                                                                         (REF_INT *)
                                                                         ((long)&min_dot + 4));
                                                    if (uVar4 != 0) {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x179,"ref_inflate_face",(ulong)uVar4,"qua tri1")
                                                  ;
                                                  return uVar4;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    new_nodes[2] = ref_cell->c2n
                                                                   [ref_cell->size_per * nquad + 3];
                                                    new_nodes[0] = *(REF_INT *)
                                                                    ((long)pvStack_180 +
                                                                    (long)node1_00 * 4);
                                                    new_nodes[1] = *(REF_INT *)
                                                                    ((long)pvStack_180 +
                                                                    (long)node0_00 * 4);
                                                    tris[1] = node0_00;
                                                    uVar4 = ref_cell_add(ref_cell_00,tris + 1,
                                                                         (REF_INT *)
                                                                         ((long)&min_dot + 4));
                                                    if (uVar4 != 0) {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x16f,"ref_inflate_face",(ulong)uVar4,"qua tri1")
                                                  ;
                                                  return uVar4;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  for (node0 = 0; node0 < ref_cell->max;
                                                      node0 = node0 + 1) {
                                                    RVar2 = ref_cell_nodes(ref_cell,node0,
                                                                           new_nodes + 0x1a);
                                                    if ((RVar2 == 0) &&
                                                       (RVar3 = ref_dict_has_key(faceids,nodes[1]),
                                                       RVar3 != 0)) {
                                                      tris[1] = new_nodes[0x1a];
                                                      new_nodes[0] = local_e4;
                                                      new_nodes[1] = *(REF_INT *)
                                                                      ((long)pvStack_180 +
                                                                      (long)new_nodes[0x1a] * 4);
                                                      new_nodes[2] = *(REF_INT *)
                                                                      ((long)pvStack_180 +
                                                                      (long)nodes[0] * 4);
                                                      new_nodes[3] = *(REF_INT *)
                                                                      ((long)pvStack_180 +
                                                                      (long)local_e4 * 4);
                                                      uVar4 = ref_inflate_pri_min_dot
                                                                        (ref_node_00,tris + 1,
                                                                         normal + 2);
                                                      if (uVar4 != 0) {
                                                        printf("%s: %d: %s: %d %s\n",
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x18a,"ref_inflate_face",(ulong)uVar4,"md");
                                                  return uVar4;
                                                  }
                                                  if (normal[2] <= 0.0) {
                                                    printf("min_dot %f near %f %f %f\n",normal[2],
                                                           ref_node_00->real[new_nodes[0x1a] * 0xf],
                                                           ref_node_00->real
                                                           [new_nodes[0x1a] * 0xf + 1],
                                                           ref_node_00->real
                                                           [new_nodes[0x1a] * 0xf + 2]);
                                                    bVar1 = true;
                                                  }
                                                  uVar4 = ref_cell_add(ref_cell_01,tris + 1,
                                                                       (REF_INT *)
                                                                       ((long)&min_dot + 4));
                                                  if (uVar4 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x193,"ref_inflate_face",(ulong)uVar4,"pri");
                                                  return uVar4;
                                                  }
                                                  }
                                                  }
                                                  for (node0 = 0; node0 < ref_cell->max;
                                                      node0 = node0 + 1) {
                                                    RVar2 = ref_cell_nodes(ref_cell,node0,
                                                                           new_nodes + 0x1a);
                                                    if ((RVar2 == 0) &&
                                                       (RVar3 = ref_dict_has_key(faceids,nodes[1]),
                                                       RVar3 != 0)) {
                                                      new_nodes[0x1a] =
                                                           *(REF_INT *)
                                                            ((long)pvStack_180 +
                                                            (long)new_nodes[0x1a] * 4);
                                                      uVar4 = ref_cell_replace_whole
                                                                        (ref_cell,node0,
                                                                         new_nodes + 0x1a);
                                                      if (uVar4 != 0) {
                                                        printf("%s: %d: %s: %d %s\n",
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x19c,"ref_inflate_face",(ulong)uVar4,"repl");
                                                  return uVar4;
                                                  }
                                                  }
                                                  }
                                                  if (global != 0) {
                                                    free((void *)global);
                                                  }
                                                  if (pvStack_180 != (void *)0x0) {
                                                    free(pvStack_180);
                                                  }
                                                  ref_grid_local._4_4_ =
                                                       ref_gather_tec_movie_frame(ref_grid,"layer");
                                                  if (ref_grid_local._4_4_ == 0) {
                                                    if (bVar1) {
                                                      printf(
                                                  "ERROR: inflated grid invalid, writing ref_inflate_problem.tec\n"
                                                  );
                                                  ref_grid_local._4_4_ =
                                                       ref_export_tec_surf(ref_grid,
                                                  "ref_inflate_problem.tec");
                                                  if (ref_grid_local._4_4_ == 0) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x1a8,"ref_inflate_face",
                                                  "problem detected, examine ref_inflate_problem.tec"
                                                  );
                                                  ref_grid_local._4_4_ = 1;
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x1a7,"ref_inflate_face",
                                                  (ulong)ref_grid_local._4_4_,"tec");
                                                  }
                                                  }
                                                  else {
                                                    ref_grid_local._4_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x1a3,"ref_inflate_face",
                                                  (ulong)ref_grid_local._4_4_,"movie frame");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x14f,"ref_inflate_face",
                                                  (ulong)ref_grid_local._4_4_,
                                                  "set new ghost node xyz");
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x109,"ref_inflate_face",
                                                  (ulong)ref_grid_local._4_4_,"update ghosts");
                                                  }
                                                  }
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0xff,"ref_inflate_face",
                                                  (ulong)ref_grid_local._4_4_,"shift glob");
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                 ,0x97,"ref_inflate_face",(ulong)ref_grid_local._4_4_,"bcast");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                               ,0x96,"ref_inflate_face",(ulong)ref_grid_local._4_4_,"max thresh");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                             ,0x94,"ref_inflate_face",(ulong)ref_grid_local._4_4_,"bcast");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                           ,0x93,"ref_inflate_face",(ulong)ref_grid_local._4_4_,"max thresh");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_face(REF_GRID ref_grid, REF_DICT faceids,
                                    REF_DBL *origin, REF_DBL thickness,
                                    REF_DBL xshift) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL pri = ref_grid_pri(ref_grid);
  REF_INT cell, tri_side, node0, node1;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ntri, tris[2], nquad, quads[2];
  REF_INT tri_node;
  REF_INT *o2n, o2n_max;
  REF_GLOB *o2g;
  REF_GLOB global;
  REF_INT new_node, node;
  REF_INT new_cell;
  REF_DBL min_dot;

  REF_DBL normal[3], dot;
  REF_INT ref_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, ref;

  REF_DBL *ymin, *ymax, dy, y0, y1, temp;
  REF_DBL *orient;
  REF_DBL *tmin, *tmax;
  REF_INT *imin, *imax;
  REF_DBL *face_normal;
  REF_INT i;
  REF_DBL theta;

  REF_BOOL problem_detected = REF_FALSE;

  REF_BOOL debug = REF_FALSE;
  REF_BOOL verbose = REF_FALSE;

  ref_malloc_init(face_normal, 3 * ref_dict_n(faceids), REF_DBL, -1.0);

  /* determine each faceids normal, only needed if my part has a tri */

  ref_malloc_init(ymin, ref_dict_n(faceids), REF_DBL, REF_DBL_MAX);
  ref_malloc_init(ymax, ref_dict_n(faceids), REF_DBL, -REF_DBL_MAX);
  ref_malloc_init(orient, ref_dict_n(faceids), REF_DBL, 1);

  y0 = REF_DBL_MAX;
  y1 = -REF_DBL_MAX;
  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_node = 0; tri_node < 3; tri_node++) {
        RSS(ref_dict_location(faceids, nodes[3], &i), "key loc");
        node = nodes[tri_node];
        dy = ref_node_xyz(ref_node, 1, node) - origin[1];
        if (ymin[i] > dy) {
          ymin[i] = dy;
        }
        if (ymax[i] < dy) {
          ymax[i] = dy;
        }
        if (y0 > dy) {
          y0 = dy;
        }
        if (y1 < dy) {
          y1 = dy;
        }
      }
    }
  }
  temp = y0;
  RSS(ref_mpi_min(ref_mpi, &temp, &y0, REF_DBL_TYPE), "max thresh");
  RSS(ref_mpi_bcast(ref_mpi, &y0, 1, REF_DBL_TYPE), "bcast");
  temp = y1;
  RSS(ref_mpi_max(ref_mpi, &temp, &y1, REF_DBL_TYPE), "max thresh");
  RSS(ref_mpi_bcast(ref_mpi, &y1, 1, REF_DBL_TYPE), "bcast");

  if (verbose) printf("y %f %f\n", y0, y1);
  each_ref_dict_key_index(faceids, i) {
    temp = ymin[i];
    RSS(ref_mpi_min(ref_mpi, &temp, &(ymin[i]), REF_DBL_TYPE), "max thresh");
    RSS(ref_mpi_bcast(ref_mpi, &(ymin[i]), 1, REF_DBL_TYPE), "bcast");
    temp = ymax[i];
    RSS(ref_mpi_max(ref_mpi, &temp, &(ymax[i]), REF_DBL_TYPE), "max thresh");
    RSS(ref_mpi_bcast(ref_mpi, &(ymax[i]), 1, REF_DBL_TYPE), "bcast");
    if (y1 - ymax[i] > ymin[i] - y0) {
      orient[i] = -1.0;
    } else {
      orient[i] = 1.0;
    }
    if (verbose) printf("%d z %f %f o %f\n", i, ymin[i], ymax[i], orient[i]);
  }

  ref_malloc_init(tmin, ref_dict_n(faceids), REF_DBL, 4.0 * ref_math_pi);
  ref_malloc_init(tmax, ref_dict_n(faceids), REF_DBL, -4.0 * ref_math_pi);
  ref_malloc_init(imin, ref_dict_n(faceids), REF_INT, REF_EMPTY);
  ref_malloc_init(imax, ref_dict_n(faceids), REF_INT, REF_EMPTY);

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3]))
      for (tri_node = 0; tri_node < 3; tri_node++) {
        RSS(ref_dict_location(faceids, nodes[3], &i), "key loc");
        node = nodes[tri_node];
        theta =
            atan2((ref_node_xyz(ref_node, 2, node) - origin[2]),
                  orient[i] * (ref_node_xyz(ref_node, 1, node) - origin[1]));

        if (tmin[i] > theta) {
          tmin[i] = theta;
          imin[i] = node;
        }
        if (tmax[i] < theta) {
          tmax[i] = theta;
          imax[i] = node;
        }
      }
  }

  if (debug) ref_dict_inspect(faceids);

  each_ref_dict_key_index(faceids, i) {
    if (!ref_mpi_para(ref_mpi)) {
      RUB(REF_EMPTY, imin[i], "imin",
          { printf("empty %d: %d \n", i, ref_dict_key(faceids, i)); });
      RUB(REF_EMPTY, imax[i], "imax",
          { printf("empty %d: %d \n", i, ref_dict_key(faceids, i)); });
    }
    if (REF_EMPTY != imin[i] && REF_EMPTY != imax[i]) {
      face_normal[0 + 3 * i] = 0.0;
      face_normal[1 + 3 * i] = (ref_node_xyz(ref_node, 2, imax[i]) -
                                ref_node_xyz(ref_node, 2, imin[i]));
      face_normal[2 + 3 * i] = -(ref_node_xyz(ref_node, 1, imax[i]) -
                                 ref_node_xyz(ref_node, 1, imin[i]));
      face_normal[1 + 3 * i] *= -orient[i];
      face_normal[2 + 3 * i] *= -orient[i];
      if (debug)
        printf("n=(%f,%f,%f)\n", face_normal[0 + 3 * i], face_normal[1 + 3 * i],
               face_normal[2 + 3 * i]);
      RSS(ref_math_normalize(&(face_normal[3 * i])), "make face norm");
      if (verbose && ref_mpi_once(ref_mpi))
        printf(
            "f=%5d n=(%7.4f,%7.4f,%7.4f) t=(%7.4f,%7.4f) angle %7.4f"
            " or %4.1f\n",
            ref_dict_key(faceids, i), face_normal[0 + 3 * i],
            face_normal[1 + 3 * i], face_normal[2 + 3 * i], tmin[i], tmax[i],
            ABS(tmin[i] - tmax[i]), orient[i]);
    }
  }

  ref_free(imax);
  ref_free(imin);
  ref_free(tmax);
  ref_free(tmin);

  ref_free(orient);

  ref_free(ymax);
  ref_free(ymin);

  o2n_max = ref_node_max(ref_node);
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  /* build list of node globals */
  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_node = 0; tri_node < 3; tri_node++) {
        node = nodes[tri_node];
        if (ref_node_owned(ref_node, node) && REF_EMPTY == o2n[node]) {
          RSS(ref_node_next_global(ref_node, &global), "global");
          RSS(ref_node_add(ref_node, global, &new_node), "add node");
          /* redundant */
          ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
          o2n[node] = new_node;
        }
      }
    }
  }

  /* sync globals */
  RSS(ref_node_shift_new_globals(ref_node), "shift glob");

  ref_malloc_init(o2g, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  /* fill ghost node globals */
  for (node = 0; node < o2n_max; node++) {
    if (REF_EMPTY != o2n[node]) {
      o2g[node] = ref_node_global(ref_node, o2n[node]);
    }
  }
  RSS(ref_node_ghost_glob(ref_node, o2g, 1), "update ghosts");

  ref_free(o2n);
  o2n_max = ref_node_max(ref_node);
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  for (node = 0; node < o2n_max; node++) {
    if (REF_EMPTY != o2g[node]) {
      /* returns node if already added */
      RSS(ref_node_add(ref_node, o2g[node], &new_node), "add node");
      ref_node_part(ref_node, new_node) = ref_node_part(ref_node, node);
      o2n[node] = new_node;
    }
  }

  /* create offsets */
  for (node = 0; node < o2n_max; node++) {
    if (ref_node_valid(ref_node, node)) {
      if (ref_node_owned(ref_node, node) && REF_EMPTY != o2n[node]) {
        new_node = o2n[node];
        normal[0] = 0.0;
        normal[1] = ref_node_xyz(ref_node, 1, node) - origin[1];
        normal[2] = ref_node_xyz(ref_node, 2, node) - origin[2];
        RSS(ref_math_normalize(normal), "make norm");
        each_ref_cell_having_node(tri, node, item, ref) {
          RSS(ref_cell_nodes(tri, ref, ref_nodes), "cell");
          if (!ref_dict_has_key(faceids, ref_nodes[3])) continue;
          RSS(ref_dict_location(faceids, ref_nodes[3], &i), "key loc");
          dot = -ref_math_dot(normal, &(face_normal[3 * i]));
          RAS(face_normal[0 + 3 * i] > -0.1, "uninitialized face_normal");
          if (dot < 0.70 || dot > 1.01) {
            printf("out-of-range dot %.15f at %f %f %f\n", dot,
                   ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            problem_detected = REF_TRUE;
          }
          RAB(ref_math_divisible(normal[1], dot), "normal[1] /= dot", {
            printf("dot %e\n", dot);
            printf(" xyz %f %f %f\n", ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            printf(" norm %f %f %f\n", normal[0], normal[1], normal[2]);
            printf("%d face norm %f %f %f\n", i, face_normal[0 + 3 * i],
                   face_normal[1 + 3 * i], face_normal[2 + 3 * i]);
          });
          RAB(ref_math_divisible(normal[2], dot), "normal[2] /= dot", {
            printf("dot %e\n", dot);
            printf(" xyz %f %f %f\n", ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            printf(" norm %f %f %f\n", normal[0], normal[1], normal[2]);
            printf("%d face norm %f %f %f\n", i, face_normal[0 + 3 * i],
                   face_normal[1 + 3 * i], face_normal[2 + 3 * i]);
          });
          normal[1] /= dot;
          normal[2] /= dot;
        }
        ref_node_xyz(ref_node, 0, new_node) =
            xshift + ref_node_xyz(ref_node, 0, node);
        ref_node_xyz(ref_node, 1, new_node) =
            thickness * normal[1] + ref_node_xyz(ref_node, 1, node);
        ref_node_xyz(ref_node, 2, new_node) =
            thickness * normal[2] + ref_node_xyz(ref_node, 2, node);
      }
    }
  }

  if (problem_detected) printf("ERROR: new node normal\n");

  RSS(ref_node_ghost_real(ref_node), "set new ghost node xyz");

  ref_free(face_normal);

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_side = 0; tri_side < 3; tri_side++) {
        node0 = ref_cell_e2n(tri, 0, tri_side, cell);
        node1 = ref_cell_e2n(tri, 1, tri_side, cell);
        if (ref_node_owned(ref_node, node0) ||
            ref_node_owned(ref_node, node1)) {
          RSS(ref_cell_list_with2(tri, node0, node1, 2, &ntri, tris),
              "bad tri count");
          if (1 == ntri) {
            RSS(ref_cell_list_with2(qua, node0, node1, 2, &nquad, quads),
                "bad quad count");
            REIS(1, nquad, "tri without quad");
            new_nodes[4] = ref_cell_c2n(qua, 4, quads[0]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
          if (ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[0])) &&
              !ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[1]))) {
            new_nodes[4] = ref_cell_c2n(tri, 3, tris[1]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
          if (!ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[0])) &&
              ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[1]))) {
            new_nodes[4] = ref_cell_c2n(tri, 3, tris[0]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
        }
      }
    }
  }

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      new_nodes[0] = nodes[0];
      new_nodes[1] = nodes[2];
      new_nodes[2] = nodes[1];
      new_nodes[3] = o2n[nodes[0]];
      new_nodes[4] = o2n[nodes[2]];
      new_nodes[5] = o2n[nodes[1]];

      RSS(ref_inflate_pri_min_dot(ref_node, new_nodes, &min_dot), "md");
      if (min_dot <= 0.0) {
        printf("min_dot %f near %f %f %f\n", min_dot,
               ref_node_xyz(ref_node, 0, nodes[0]),
               ref_node_xyz(ref_node, 1, nodes[0]),
               ref_node_xyz(ref_node, 2, nodes[0]));
        problem_detected = REF_TRUE;
      }

      RSS(ref_cell_add(pri, new_nodes, &new_cell), "pri");
    }
  }

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      nodes[0] = o2n[nodes[0]];
      nodes[1] = o2n[nodes[1]];
      nodes[2] = o2n[nodes[2]];
      RSS(ref_cell_replace_whole(tri, cell, nodes), "repl");
    }
  }

  ref_free(o2g);
  ref_free(o2n);

  ref_gather_blocking_frame(ref_grid, "layer");

  if (problem_detected) {
    printf("ERROR: inflated grid invalid, writing ref_inflate_problem.tec\n");
    RSS(ref_export_tec_surf(ref_grid, "ref_inflate_problem.tec"), "tec");
    THROW("problem detected, examine ref_inflate_problem.tec");
  }

  return REF_SUCCESS;
}